

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SwapMethod::doRNEMDImpl
          (SwapMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  double *pdVar8;
  long in_RDI;
  double dVar9;
  double dVar10;
  Vector3d max_angMom;
  Vector3d min_angMom;
  RealType temp_vel;
  Vector3d max_vel;
  Vector3d min_vel;
  int k_1;
  int j_1;
  int i_1;
  Mat3x3d I_1;
  Vector3d angMom_1;
  RealType value_1;
  Vector3d vel_1;
  RealType mass_1;
  Vector3d pos_1;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  RealType value;
  Vector3d vel;
  RealType mass;
  Vector3d pos;
  StuntDouble *max_sd;
  int max_found;
  RealType max_val;
  StuntDouble *min_sd;
  int min_found;
  RealType min_val;
  StuntDouble *sd;
  int selej;
  int selei;
  StuntDouble *in_stack_fffffffffffffb60;
  StuntDouble *in_stack_fffffffffffffb68;
  SelectionManager *in_stack_fffffffffffffb70;
  Vector3d *in_stack_fffffffffffffbd8;
  Snapshot *in_stack_fffffffffffffbe0;
  Vector3<double> local_1f0;
  Vector3<double> local_1d8;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  RectMatrix<double,_3U,_3U> local_1b0;
  Vector<double,_3U> local_168;
  double local_150;
  Vector<double,_3U> local_148;
  double local_130;
  uint local_110;
  uint local_10c;
  int local_108;
  RectMatrix<double,_3U,_3U> local_f8;
  Vector<double,_3U> local_b0;
  double local_98;
  Vector<double,_3U> local_90;
  double local_78;
  StuntDouble *local_58;
  int local_4c;
  double local_48;
  StuntDouble *local_40;
  int local_34;
  double local_30;
  StuntDouble *local_28;
  
  if ((*(byte *)(in_RDI + 0x288) & 1) != 0) {
    local_30 = 0.0;
    local_34 = 0;
    local_40 = (StuntDouble *)0x0;
    local_48 = 0.0;
    local_4c = 0;
    local_58 = (StuntDouble *)0x0;
    local_28 = SelectionManager::beginSelected
                         (in_stack_fffffffffffffb70,(int *)in_stack_fffffffffffffb68);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffb68);
      if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
        Snapshot::wrapVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      local_78 = StuntDouble::getMass(local_28);
      StuntDouble::getVel(in_stack_fffffffffffffb68);
      dVar10 = local_78;
      local_98 = 0.0;
      switch(*(undefined4 *)(in_RDI + 0x244)) {
      case 0:
        local_98 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3fca1c);
        local_98 = dVar10 * local_98;
        bVar7 = StuntDouble::isDirectional(in_stack_fffffffffffffb60);
        if (bVar7) {
          StuntDouble::getJ(in_stack_fffffffffffffb68);
          (*local_28->_vptr_StuntDouble[5])(&local_f8);
          bVar7 = StuntDouble::isLinear(local_28);
          if (bVar7) {
            local_108 = StuntDouble::linearAxis(local_28);
            local_10c = local_108 + 1 + ((local_108 + 1) / 3) * -3;
            local_110 = local_108 + 2 + ((local_108 + 2) / 3) * -3;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,local_10c);
            dVar10 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,local_10c);
            dVar1 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_f8,local_10c,local_10c);
            dVar2 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,local_110);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,local_110);
            dVar4 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_f8,local_110,local_110);
            local_98 = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / *pdVar8 + local_98;
          }
          else {
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,0);
            dVar10 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,0);
            dVar1 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_f8,0,0);
            dVar2 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,1);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,1);
            dVar4 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_f8,1,1);
            dVar5 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,2);
            dVar9 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_b0,2);
            dVar6 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_f8,2,2);
            local_98 = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / dVar5 +
                       (dVar9 * dVar6) / *pdVar8 + local_98;
          }
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3fcf0b);
        }
        local_98 = local_98 * 0.5;
        break;
      default:
        break;
      case 3:
        pdVar8 = Vector<double,_3U>::operator[](&local_90,0);
        local_98 = dVar10 * *pdVar8;
        break;
      case 4:
        pdVar8 = Vector<double,_3U>::operator[](&local_90,1);
        local_98 = dVar10 * *pdVar8;
        break;
      case 5:
        pdVar8 = Vector<double,_3U>::operator[](&local_90,2);
        local_98 = dVar10 * *pdVar8;
      }
      if (local_4c == 0) {
        local_48 = local_98;
        local_58 = local_28;
        local_4c = 1;
      }
      else if (local_48 < local_98) {
        local_48 = local_98;
        local_58 = local_28;
      }
      local_28 = SelectionManager::nextSelected
                           (in_stack_fffffffffffffb70,(int *)in_stack_fffffffffffffb68);
    }
    local_28 = SelectionManager::beginSelected
                         (in_stack_fffffffffffffb70,(int *)in_stack_fffffffffffffb68);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffb68);
      if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
        Snapshot::wrapVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      local_130 = StuntDouble::getMass(local_28);
      StuntDouble::getVel(in_stack_fffffffffffffb68);
      dVar10 = local_130;
      local_150 = 0.0;
      switch(*(undefined4 *)(in_RDI + 0x244)) {
      case 0:
        local_150 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3fd16f);
        local_150 = dVar10 * local_150;
        bVar7 = StuntDouble::isDirectional(in_stack_fffffffffffffb60);
        if (bVar7) {
          StuntDouble::getJ(in_stack_fffffffffffffb68);
          (*local_28->_vptr_StuntDouble[5])(&local_1b0);
          bVar7 = StuntDouble::isLinear(local_28);
          if (bVar7) {
            local_1b4 = StuntDouble::linearAxis(local_28);
            local_1b8 = local_1b4 + 1 + ((local_1b4 + 1) / 3) * -3;
            local_1bc = local_1b4 + 2 + ((local_1b4 + 2) / 3) * -3;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,local_1b8);
            dVar10 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,local_1b8);
            dVar1 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_1b0,local_1b8,local_1b8);
            dVar2 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,local_1bc);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,local_1bc);
            dVar4 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_1b0,local_1bc,local_1bc);
            local_150 = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / *pdVar8 + local_150;
          }
          else {
            pdVar8 = Vector<double,_3U>::operator[](&local_168,0);
            dVar10 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,0);
            dVar1 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_1b0,0,0);
            dVar2 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,1);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,1);
            dVar4 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_1b0,1,1);
            dVar5 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_168,2);
            in_stack_fffffffffffffbd8 = (Vector3d *)*pdVar8;
            in_stack_fffffffffffffbe0 = (Snapshot *)Vector<double,_3U>::operator[](&local_168,2);
            dVar9 = (double)in_stack_fffffffffffffbd8 *
                    (double)(in_stack_fffffffffffffbe0->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_1b0,2,2);
            local_150 = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / dVar5 + dVar9 / *pdVar8 +
                        local_150;
          }
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3fd652);
        }
        local_150 = local_150 * 0.5;
        break;
      default:
        break;
      case 3:
        pdVar8 = Vector<double,_3U>::operator[](&local_148,0);
        local_150 = dVar10 * *pdVar8;
        break;
      case 4:
        pdVar8 = Vector<double,_3U>::operator[](&local_148,1);
        local_150 = dVar10 * *pdVar8;
        break;
      case 5:
        pdVar8 = Vector<double,_3U>::operator[](&local_148,2);
        local_150 = dVar10 * *pdVar8;
      }
      if (local_34 == 0) {
        local_30 = local_150;
        local_40 = local_28;
        local_34 = 1;
      }
      else if (local_150 < local_30) {
        local_30 = local_150;
        local_40 = local_28;
      }
      local_28 = SelectionManager::nextSelected
                           (in_stack_fffffffffffffb70,(int *)in_stack_fffffffffffffb68);
    }
    if ((local_4c == 0) || (local_34 == 0)) {
      snprintf(painCave.errMsg,2000,
               "Swap exchange NOT performed because selected object\n\twas not present in at least one of the two slabs.\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      *(int *)(in_RDI + 0x32c) = *(int *)(in_RDI + 0x32c) + 1;
    }
    else if (local_48 <= local_30) {
      snprintf(painCave.errMsg,2000,
               "RNEMD::doSwap exchange NOT performed because min_val > max_val\n");
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      *(int *)(in_RDI + 0x32c) = *(int *)(in_RDI + 0x32c) + 1;
    }
    else {
      StuntDouble::getVel(in_stack_fffffffffffffb68);
      StuntDouble::getVel(in_stack_fffffffffffffb68);
      switch(*(undefined4 *)(in_RDI + 0x244)) {
      case 0:
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        bVar7 = StuntDouble::isDirectional(in_stack_fffffffffffffb60);
        if ((bVar7) && (bVar7 = StuntDouble::isDirectional(in_stack_fffffffffffffb60), bVar7)) {
          StuntDouble::getJ(in_stack_fffffffffffffb68);
          StuntDouble::getJ(in_stack_fffffffffffffb68);
          StuntDouble::setJ((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
          StuntDouble::setJ((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        }
        break;
      default:
        break;
      case 3:
        pdVar8 = Vector3<double>::x(&local_1d8);
        dVar10 = *pdVar8;
        pdVar8 = Vector3<double>::x(&local_1f0);
        dVar1 = *pdVar8;
        pdVar8 = Vector3<double>::x(&local_1d8);
        *pdVar8 = dVar1;
        pdVar8 = Vector3<double>::x(&local_1f0);
        *pdVar8 = dVar10;
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        break;
      case 4:
        pdVar8 = Vector3<double>::y(&local_1d8);
        dVar10 = *pdVar8;
        pdVar8 = Vector3<double>::y(&local_1f0);
        dVar1 = *pdVar8;
        pdVar8 = Vector3<double>::y(&local_1d8);
        *pdVar8 = dVar1;
        pdVar8 = Vector3<double>::y(&local_1f0);
        *pdVar8 = dVar10;
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        break;
      case 5:
        pdVar8 = Vector3<double>::z(&local_1d8);
        dVar10 = *pdVar8;
        pdVar8 = Vector3<double>::z(&local_1f0);
        dVar1 = *pdVar8;
        pdVar8 = Vector3<double>::z(&local_1d8);
        *pdVar8 = dVar1;
        pdVar8 = Vector3<double>::z(&local_1f0);
        *pdVar8 = dVar10;
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
        StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffb70,
                            (Vector3d *)in_stack_fffffffffffffb68);
      }
      switch(*(undefined4 *)(in_RDI + 0x244)) {
      case 0:
        *(double *)(in_RDI + 0x2e8) = (local_48 - local_30) + *(double *)(in_RDI + 0x2e8);
        break;
      default:
        break;
      case 3:
        dVar10 = local_48 - local_30;
        pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x2f8));
        *pdVar8 = dVar10 + *pdVar8;
        break;
      case 4:
        dVar10 = local_48 - local_30;
        pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x2f8));
        *pdVar8 = dVar10 + *pdVar8;
        break;
      case 5:
        dVar10 = local_48 - local_30;
        pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x2f8));
        *pdVar8 = dVar10 + *pdVar8;
      }
    }
  }
  return;
}

Assistant:

void SwapMethod::doRNEMDImpl(SelectionManager& smanA,
                               SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    RealType min_val(0.0);
    int min_found       = 0;
    StuntDouble* min_sd = NULL;

    RealType max_val(0.0);
    int max_found       = 0;
    StuntDouble* max_sd = NULL;

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }
      if (!max_found) {
        max_val   = value;
        max_sd    = sd;
        max_found = 1;
      } else {
        if (max_val < value) {
          max_val = value;
          max_sd  = sd;
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }

      if (!min_found) {
        min_val   = value;
        min_sd    = sd;
        min_found = 1;
      } else {
        if (min_val > value) {
          min_val = value;
          min_sd  = sd;
        }
      }
    }

#ifdef IS_MPI
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    int my_min_found = min_found;
    int my_max_found = max_found;

    // Even if we didn't find a minimum, did someone else?
    MPI_Allreduce(&my_min_found, &min_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
    // Even if we didn't find a maximum, did someone else?
    MPI_Allreduce(&my_max_found, &max_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
#endif

    if (max_found && min_found) {
#ifdef IS_MPI
      struct {
        RealType val;
        int rank;
      } max_vals, min_vals;

      if (my_min_found) {
        min_vals.val = min_val;
      } else {
        min_vals.val = HONKING_LARGE_VALUE;
      }
      min_vals.rank = worldRank;

      // Who had the minimum?
      MPI_Allreduce(&min_vals, &min_vals, 1, MPI_REALTYPE_INT, MPI_MINLOC,
                    MPI_COMM_WORLD);
      min_val = min_vals.val;

      if (my_max_found) {
        max_vals.val = max_val;
      } else {
        max_vals.val = -HONKING_LARGE_VALUE;
      }
      max_vals.rank = worldRank;

      // Who had the maximum?
      MPI_Allreduce(&max_vals, &max_vals, 1, MPI_REALTYPE_INT, MPI_MAXLOC,
                    MPI_COMM_WORLD);
      max_val = max_vals.val;
#endif

      if (min_val < max_val) {
#ifdef IS_MPI
        if (max_vals.rank == worldRank && min_vals.rank == worldRank) {
          // I have both maximum and minimum, so proceed like a single
          // processor version:
#endif

          Vector3d min_vel = min_sd->getVel();
          Vector3d max_vel = max_sd->getVel();
          RealType temp_vel;

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            max_sd->setVel(min_vel);
            if (min_sd->isDirectional() && max_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom = max_sd->getJ();
              min_sd->setJ(max_angMom);
              max_sd->setJ(min_angMom);
            }  // angular momenta exchange enabled
               // assumes same rigid body identity
            break;
          case rnemdPx:
            temp_vel    = min_vel.x();
            min_vel.x() = max_vel.x();
            max_vel.x() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            temp_vel    = min_vel.y();
            min_vel.y() = max_vel.y();
            max_vel.y() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            temp_vel    = min_vel.z();
            min_vel.z() = max_vel.z();
            max_vel.z() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }

#ifdef IS_MPI
          // the rest of the cases only apply in parallel simulations:
        } else if (max_vals.rank == worldRank) {
          // I had the max, but not the minimum

          Vector3d min_vel;
          Vector3d max_vel = max_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(max_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       min_vals.rank, 0, min_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, min_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            max_sd->setVel(min_vel);
            // angular momenta exchange enabled
            if (max_sd->isDirectional()) {
              Vector3d min_angMom;
              Vector3d max_angMom = max_sd->getJ();

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(max_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           min_vals.rank, 1, min_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, min_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              max_sd->setJ(min_angMom);
            }
            break;
          case rnemdPx:
            max_vel.x() = min_vel.x();
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            max_vel.y() = min_vel.y();
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            max_vel.z() = min_vel.z();
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }
        } else if (min_vals.rank == worldRank) {
          // I had the minimum but not the maximum:

          Vector3d max_vel;
          Vector3d min_vel = min_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(min_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       max_vals.rank, 0, max_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, max_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            // angular momenta exchange enabled
            if (min_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom;

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(min_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           max_vals.rank, 1, max_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, max_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              min_sd->setJ(max_angMom);
            }
            break;
          case rnemdPx:
            min_vel.x() = max_vel.x();
            min_sd->setVel(min_vel);
            break;
          case rnemdPy:
            min_vel.y() = max_vel.y();
            min_sd->setVel(min_vel);
            break;
          case rnemdPz:
            min_vel.z() = max_vel.z();
            min_sd->setVel(min_vel);
            break;
          default:
            break;
          }
        }
#endif

        switch (rnemdFluxType_) {
        case rnemdKE:
          kineticExchange_ += max_val - min_val;
          break;
        case rnemdPx:
          momentumExchange_.x() += max_val - min_val;
          break;
        case rnemdPy:
          momentumExchange_.y() += max_val - min_val;
          break;
        case rnemdPz:
          momentumExchange_.z() += max_val - min_val;
          break;
        default:
          break;
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::doSwap exchange NOT performed "
                 "because min_val > max_val\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        failTrialCount_++;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Swap exchange NOT performed because selected object\n"
               "\twas not present in at least one of the two slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }